

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int gost_imit_update(EVP_MD_CTX *ctx,void *data,size_t count)

{
  ossl_gost_imit_ctx *c;
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  
  c = (ossl_gost_imit_ctx *)EVP_MD_CTX_get0_md_data();
  if (c->key_set == 0) {
    ERR_GOST_error(0x73,0x79,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_crypt.c"
                   ,0x5fc);
    return 0;
  }
  uVar1 = (ulong)c->bytes_left;
  if (uVar1 != 0) {
    uVar2 = uVar1;
    sVar3 = count;
    if (count != 0 && (uint)c->bytes_left < 8) {
      do {
        c->partial_block[uVar2] = *data;
        count = sVar3 - 1;
        uVar1 = uVar2 + 1;
        data = (void *)((long)data + 1);
        if (6 < uVar2) break;
        bVar4 = sVar3 != 1;
        uVar2 = uVar1;
        sVar3 = count;
      } while (bVar4);
    }
    if (uVar1 != 8) {
      c->bytes_left = (int)uVar1;
      return 1;
    }
    mac_block_mesh(c,c->partial_block);
  }
  if (count < 9) {
    if (count == 0) {
      count = 0;
      goto LAB_00117711;
    }
  }
  else {
    do {
      mac_block_mesh(c,(uchar *)data);
      data = (void *)((long)data + 8);
      count = count - 8;
    } while (8 < count);
  }
  memcpy(c->partial_block,data,count);
LAB_00117711:
  c->bytes_left = (int)count;
  return 1;
}

Assistant:

static int gost_imit_update(EVP_MD_CTX *ctx, const void *data, size_t count)
{
    struct ossl_gost_imit_ctx *c = EVP_MD_CTX_md_data(ctx);
    const unsigned char *p = data;
    size_t bytes = count;
    if (!(c->key_set)) {
        GOSTerr(GOST_F_GOST_IMIT_UPDATE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }
    if (c->bytes_left) {
        size_t i;
        for (i = c->bytes_left; i < 8 && bytes > 0; bytes--, i++, p++) {
            c->partial_block[i] = *p;
        }
        if (i == 8) {
            mac_block_mesh(c, c->partial_block);
        } else {
            c->bytes_left = i;
            return 1;
        }
    }
    while (bytes > 8) {
        mac_block_mesh(c, p);
        p += 8;
        bytes -= 8;
    }
    if (bytes > 0) {
        memcpy(c->partial_block, p, bytes);
    }
    c->bytes_left = bytes;
    return 1;
}